

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_integer_points_kd_tree_decoder.h
# Opt level: O1

void __thiscall
draco::DynamicIntegerPointsKdTreeDecoder<6>::DynamicIntegerPointsKdTreeDecoder
          (DynamicIntegerPointsKdTreeDecoder<6> *this,uint32_t dimension)

{
  void *pvVar1;
  ulong __n;
  ulong __n_00;
  allocator_type local_6e;
  allocator_type local_6d;
  value_type_conflict5 local_6c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_68;
  HalfDecoder *local_50;
  AxisDecoder *local_48;
  RemainingBitsDecoder *local_40;
  NumbersDecoder *local_38;
  
  this->bit_length_ = 0;
  this->num_points_ = 0;
  this->num_decoded_points_ = 0;
  this->dimension_ = dimension;
  FoldedBit32Decoder<draco::RAnsBitDecoder>::FoldedBit32Decoder(&this->numbers_decoder_);
  local_38 = &this->numbers_decoder_;
  DirectBitDecoder::DirectBitDecoder(&this->remaining_bits_decoder_);
  local_40 = &this->remaining_bits_decoder_;
  DirectBitDecoder::DirectBitDecoder(&this->axis_decoder_);
  local_50 = &this->half_decoder_;
  local_48 = &this->axis_decoder_;
  DirectBitDecoder::DirectBitDecoder(local_50);
  __n = (ulong)dimension;
  local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&this->p_,__n,(value_type_conflict5 *)&local_68,(allocator_type *)&local_6c);
  local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&this->axes_,__n,(value_type_conflict5 *)&local_68,(allocator_type *)&local_6c);
  local_6c = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_68,__n,&local_6c,&local_6d);
  __n_00 = (ulong)(dimension * 0x20 + 1);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(&this->base_stack_,__n_00,&local_68,&local_6e);
  pvVar1 = (void *)CONCAT44(local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start._4_4_,
                            local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start._0_4_);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,(long)local_68.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar1);
  }
  local_6c = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_68,__n,&local_6c,&local_6d);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(&this->levels_stack_,__n_00,&local_68,&local_6e);
  pvVar1 = (void *)CONCAT44(local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start._4_4_,
                            local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start._0_4_);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,(long)local_68.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar1);
  }
  return;
}

Assistant:

explicit DynamicIntegerPointsKdTreeDecoder(uint32_t dimension)
      : bit_length_(0),
        num_points_(0),
        num_decoded_points_(0),
        dimension_(dimension),
        p_(dimension, 0),
        axes_(dimension, 0),
        // Init the stack with the maximum depth of the tree.
        // +1 for a second leaf.
        base_stack_(32 * dimension + 1, VectorUint32(dimension, 0)),
        levels_stack_(32 * dimension + 1, VectorUint32(dimension, 0)) {}